

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
common_sampler_sample_and_accept_n
          (common_sampler *gsmpl,llama_context *ctx,llama_tokens *draft,bool grammar_first)

{
  byte grammar_first_00;
  size_type sVar1;
  vector<int,_std::allocator<int>_> *this;
  reference pvVar2;
  vector<int,_std::allocator<int>_> *in_RCX;
  vector<int,_std::allocator<int>_> *in_RDX;
  llama_context *in_RSI;
  common_sampler *in_RDI;
  byte in_R8B;
  size_t i;
  vector<int,_std::allocator<int>_> idxs;
  common_sampler *__n;
  ulong local_60;
  vector<int,_std::allocator<int>_> local_40;
  common_sampler *gsmpl_00;
  
  grammar_first_00 = in_R8B & 1;
  __n = in_RDI;
  gsmpl_00 = in_RDI;
  sVar1 = std::vector<int,_std::allocator<int>_>::size(in_RCX);
  this = (vector<int,_std::allocator<int>_> *)(sVar1 + 1);
  std::allocator<int>::allocator((allocator<int> *)0x365e1b);
  std::vector<int,_std::allocator<int>_>::vector(this,(size_type)__n,(allocator_type *)in_RDI);
  std::allocator<int>::~allocator((allocator<int> *)0x365e3b);
  local_60 = 0;
  while( true ) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size(&local_40);
    if (sVar1 <= local_60) break;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,local_60);
    *pvVar2 = (value_type)local_60;
    local_60 = local_60 + 1;
  }
  common_sampler_sample_and_accept_n(gsmpl_00,in_RSI,in_RDX,in_RCX,(bool)grammar_first_00);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)in_RDI);
  return (vector<int,_std::allocator<int>_> *)__n;
}

Assistant:

std::vector<llama_token> common_sampler_sample_and_accept_n(struct common_sampler * gsmpl, struct llama_context * ctx, const llama_tokens & draft, bool grammar_first) {
    std::vector<int> idxs(draft.size() + 1);
    for (size_t i = 0; i < idxs.size(); ++i) {
        idxs[i] = i;
    }

    return common_sampler_sample_and_accept_n(gsmpl, ctx, idxs, draft, grammar_first);
}